

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void __thiscall tinyxml2::StrPair::Set(StrPair *this,char *start,char *end,int flags)

{
  if (((this->_flags & 0x200) != 0) && (this->_start != (char *)0x0)) {
    operator_delete__(this->_start);
  }
  this->_start = (char *)0x0;
  this->_end = (char *)0x0;
  this->_start = start;
  this->_end = end;
  this->_flags = flags | 0x100;
  return;
}

Assistant:

void Set( char* start, char* end, int flags ) {
        TIXMLASSERT( start );
        TIXMLASSERT( end );
        Reset();
        _start  = start;
        _end    = end;
        _flags  = flags | NEEDS_FLUSH;
    }